

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O1

bool __thiscall
BasicOCSPResponse::Decode(BasicOCSPResponse *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_00;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.prefixSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    cbUsed_00 = &sh.prefixSize;
    bVar3 = ResponseData::Decode(&this->tbsResponseData,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
    sVar2 = sh.dataSize;
    if (bVar3) {
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      lVar1 = *(long *)sh.cbCurrent;
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar3 = AlgorithmIdentifier::Decode
                        (&this->signatureAlgorithm,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
      sVar2 = sh.dataSize;
      if (bVar3) {
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
        lVar1 = *(long *)sh.cbCurrent;
        sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar3 = DerBase::Decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          (&(this->signature).super_DerBase,pIn + sVar2 + lVar1,sVar5,BitString,
                           cbUsed_00,&(this->signature).value);
        sVar2 = sh.dataSize;
        if (bVar3) {
          *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
          sh.prefixSize = 0;
          lVar1 = *(long *)sh.cbCurrent;
          sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
          bVar6 = DerBase::DecodeSet<Certificate>(pIn + sVar2 + lVar1,sVar5,cbUsed_00,&this->certs);
          goto LAB_0011c015;
        }
      }
    }
    bVar6 = 0;
  }
LAB_0011c015:
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
  sh.prefixSize = 0;
  SequenceHelper::CheckExit((SequenceHelper *)auStack_58);
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.dataSize;
  return (bool)(bVar6 & 1);
}

Assistant:

bool BasicOCSPResponse::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    if (!tbsResponseData.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!signatureAlgorithm.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!signature.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!DecodeSet(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize(), certs))
        return false;

    return true;
}